

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineComputer::ComputeLinkPath
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *libPathFlag,string *libPathTerminator)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  ItemVector *pIVar7;
  undefined8 *puVar8;
  long *plVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  OutputFormat format;
  long *plVar11;
  pointer pIVar12;
  undefined8 uVar13;
  pointer remote;
  ArtifactType artifact;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string local_58;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (cli->LinkLanguage)._M_dataplus._M_p;
  local_f8 = &local_e8;
  local_70 = __return_storage_ptr__;
  local_68 = libPathTerminator;
  local_60 = libPathFlag;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + (cli->LinkLanguage)._M_string_length);
  local_d8 = &__return_storage_ptr__->field_2;
  iVar5 = std::__cxx11::string::compare((char *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (iVar5 == 0) {
    pIVar7 = cmComputeLinkInformation::GetItems(cli);
    pIVar12 = (pIVar7->
              super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_38 = (pIVar7->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar12 != local_38) {
      do {
        pcVar2 = pIVar12->Target;
        if (pcVar2 != (cmGeneratorTarget *)0x0) {
          TVar6 = cmGeneratorTarget::GetType(pcVar2);
          if (TVar6 != STATIC_LIBRARY) {
            TVar6 = cmGeneratorTarget::GetType(pcVar2);
            if (TVar6 != SHARED_LIBRARY) goto LAB_00347562;
          }
          TVar6 = cmGeneratorTarget::GetType(pcVar2);
          artifact = RuntimeBinaryArtifact;
          if (TVar6 == SHARED_LIBRARY) {
            bVar4 = cmGeneratorTarget::IsDLLPlatform(pcVar2);
            artifact = (ArtifactType)bVar4;
          }
          std::operator+(&local_b0," ",local_60);
          pcVar2 = pIVar12->Target;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          pcVar1 = (cli->Config)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar1,pcVar1 + (cli->Config)._M_string_length);
          cmGeneratorTarget::GetDirectory(&local_d0,pcVar2,&local_58,artifact);
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            uVar13 = local_b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_d0._M_string_length + local_b0._M_string_length) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar13 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_d0._M_string_length + local_b0._M_string_length)
            goto LAB_00347367;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
          }
          else {
LAB_00347367:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
          }
          local_118 = &local_108;
          plVar9 = puVar8 + 2;
          if ((long *)*puVar8 == plVar9) {
            local_108 = *plVar9;
            uStack_100 = puVar8[3];
          }
          else {
            local_108 = *plVar9;
            local_118 = (long *)*puVar8;
          }
          local_110 = puVar8[1];
          *puVar8 = plVar9;
          puVar8[1] = 0;
          *(undefined1 *)plVar9 = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_118,(ulong)(local_68->_M_dataplus)._M_p);
          local_90 = &local_80;
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_80 = *plVar11;
            lStack_78 = plVar9[3];
          }
          else {
            local_80 = *plVar11;
            local_90 = (long *)*plVar9;
          }
          local_88 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_f8 = &local_e8;
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_e8 = *plVar11;
            lStack_e0 = plVar9[3];
          }
          else {
            local_e8 = *plVar11;
            local_f8 = (long *)*plVar9;
          }
          local_f0 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00347562:
        pIVar12 = pIVar12 + 1;
      } while (pIVar12 != local_38);
    }
  }
  pvVar10 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(cli);
  remote = (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (remote != pbVar3) {
    do {
      std::operator+(&local_b0," ",local_60);
      format = (OutputFormat)this->UseWatcomQuote;
      if (this->ForResponse != false) {
        format = RESPONSE;
      }
      cmOutputConverter::ConvertToOutputForExisting(&local_d0,this->OutputConverter,remote,format);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar13 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_d0._M_string_length + local_b0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          uVar13 = local_d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_d0._M_string_length + local_b0._M_string_length)
        goto LAB_00347622;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_00347622:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p)
        ;
      }
      plVar9 = puVar8 + 2;
      if ((long *)*puVar8 == plVar9) {
        local_108 = *plVar9;
        uStack_100 = puVar8[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar9;
        local_118 = (long *)*puVar8;
      }
      local_110 = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)plVar9 = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_118,(ulong)(local_68->_M_dataplus)._M_p);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_80 = *plVar11;
        lStack_78 = plVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar11;
        local_90 = (long *)*plVar9;
      }
      local_88 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f8 = &local_e8;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_e8 = *plVar11;
        lStack_e0 = plVar9[3];
      }
      else {
        local_e8 = *plVar11;
        local_f8 = (long *)*plVar9;
      }
      local_f0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_70,(ulong)local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      remote = remote + 1;
    } while (remote != pbVar3);
  }
  return local_70;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator)
{
  std::string linkPath;

  if (cli.GetLinkLanguage() == "Swift") {
    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->GetType() == cmStateEnums::SHARED_LIBRARY &&
            target->IsDLLPlatform()) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPath += " " + libPathFlag +
          item.Target->GetDirectory(cli.GetConfig(), type) +
          libPathTerminator + " ";
      }
    }
  }

  for (std::string const& libDir : cli.GetDirectories()) {
    linkPath += " " + libPathFlag + this->ConvertToOutputForExisting(libDir) +
      libPathTerminator + " ";
  }

  return linkPath;
}